

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall
mkvparser::Cues::Find(Cues *this,longlong time_ns,Track *pTrack,CuePoint **pCP,TrackPosition **pTP)

{
  CuePoint **ppCVar1;
  CuePoint **ppCVar2;
  CuePoint *pCVar3;
  long lVar4;
  TrackPosition *pTVar5;
  TrackPosition *pTVar6;
  longlong scale;
  CuePoint **ppCVar7;
  CuePoint **ppCVar8;
  CuePoint **ppCVar9;
  long lVar10;
  bool bVar11;
  
  if (((pTrack == (Track *)0x0 || time_ns < 0) ||
      (ppCVar2 = this->m_cue_points, ppCVar2 == (CuePoint **)0x0)) ||
     (lVar10 = this->m_count, lVar10 == 0)) {
    return false;
  }
  pCVar3 = *ppCVar2;
  *pCP = pCVar3;
  if (pCVar3 == (CuePoint *)0x0) {
    return false;
  }
  lVar4 = this->m_pSegment->m_pInfo->m_timecodeScale;
  if (pCVar3->m_timecode * lVar4 < time_ns) {
    ppCVar1 = ppCVar2 + lVar10;
    ppCVar7 = ppCVar2;
    ppCVar9 = ppCVar1;
    while (ppCVar7 < ppCVar9) {
      ppCVar8 = (CuePoint **)
                ((long)ppCVar7 +
                (((long)ppCVar9 - (long)ppCVar7 >> 3) - ((long)ppCVar9 - (long)ppCVar7 >> 0x3f) &
                0xfffffffffffffffeU) * 4);
      if ((ppCVar8 < ppCVar1) && (*ppCVar8 != (CuePoint *)0x0)) {
        lVar10 = (*ppCVar8)->m_timecode * lVar4;
        if (lVar10 - time_ns == 0 || lVar10 < time_ns) {
          ppCVar7 = ppCVar8 + 1;
          ppCVar8 = ppCVar9;
        }
        bVar11 = ppCVar7 <= ppCVar8;
        ppCVar9 = ppCVar8;
      }
      else {
        bVar11 = false;
      }
      if (!bVar11) {
        return false;
      }
    }
    if (ppCVar7 <= ppCVar2) {
      return false;
    }
    if (ppCVar7 != ppCVar9) {
      return false;
    }
    if (ppCVar1 < ppCVar7) {
      return false;
    }
    pCVar3 = ppCVar7[-1];
    *pCP = pCVar3;
    if (pCVar3 == (CuePoint *)0x0) {
      return false;
    }
    lVar10 = pCVar3->m_timecode * this->m_pSegment->m_pInfo->m_timecodeScale;
    if (lVar10 - time_ns != 0 && time_ns <= lVar10) {
      return false;
    }
    pTVar6 = pCVar3->m_track_positions;
    pTVar5 = (TrackPosition *)(pCVar3->m_track_positions_count * 8);
    lVar10 = pCVar3->m_track_positions_count * 0x18;
    do {
      if (lVar10 == 0) goto LAB_00165164;
      lVar10 = lVar10 + -0x18;
      bVar11 = pTVar6->m_track == (pTrack->m_info).number;
      if (bVar11) {
        pTVar5 = pTVar6;
      }
      pTVar6 = pTVar6 + 1;
    } while (!bVar11);
  }
  else {
    pTVar6 = pCVar3->m_track_positions;
    pTVar5 = (TrackPosition *)(pCVar3->m_track_positions_count * 8);
    lVar10 = pCVar3->m_track_positions_count * 0x18;
    do {
      if (lVar10 == 0) goto LAB_00165164;
      lVar10 = lVar10 + -0x18;
      bVar11 = pTVar6->m_track != (pTrack->m_info).number;
      if (!bVar11) {
        pTVar5 = pTVar6;
      }
      pTVar6 = pTVar6 + 1;
    } while (bVar11);
  }
LAB_00165166:
  *pTP = pTVar5;
  return pTVar5 != (TrackPosition *)0x0;
LAB_00165164:
  pTVar5 = (TrackPosition *)0x0;
  goto LAB_00165166;
}

Assistant:

bool Cues::Find(long long time_ns, const Track* pTrack, const CuePoint*& pCP,
                const CuePoint::TrackPosition*& pTP) const {
  if (time_ns < 0 || pTrack == NULL || m_cue_points == NULL || m_count == 0)
    return false;

  CuePoint** const ii = m_cue_points;
  CuePoint** i = ii;

  CuePoint** const jj = ii + m_count;
  CuePoint** j = jj;

  pCP = *i;
  if (pCP == NULL)
    return false;

  if (time_ns <= pCP->GetTime(m_pSegment)) {
    pTP = pCP->Find(pTrack);
    return (pTP != NULL);
  }

  while (i < j) {
    // INVARIANT:
    //[ii, i) <= time_ns
    //[i, j)  ?
    //[j, jj) > time_ns

    CuePoint** const k = i + (j - i) / 2;
    if (k >= jj)
      return false;

    CuePoint* const pCP = *k;
    if (pCP == NULL)
      return false;

    const long long t = pCP->GetTime(m_pSegment);

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    if (i > j)
      return false;
  }

  if (i != j || i > jj || i <= ii)
    return false;

  pCP = *--i;

  if (pCP == NULL || pCP->GetTime(m_pSegment) > time_ns)
    return false;

  // TODO: here and elsewhere, it's probably not correct to search
  // for the cue point with this time, and then search for a matching
  // track.  In principle, the matching track could be on some earlier
  // cue point, and with our current algorithm, we'd miss it.  To make
  // this bullet-proof, we'd need to create a secondary structure,
  // with a list of cue points that apply to a track, and then search
  // that track-based structure for a matching cue point.

  pTP = pCP->Find(pTrack);
  return (pTP != NULL);
}